

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

JsValueRef
Debugger::Evaluate(JsValueRef callee,bool isConstructCall,JsValueRef *arguments,
                  unsigned_short argumentCount,void *callbackState)

{
  JsErrorCode jsErrorCode_00;
  PAL_FILE *pPVar1;
  LPCWSTR pWVar2;
  JsValueRef pvStack_48;
  JsErrorCode jsErrorCode;
  JsValueRef result;
  void *pvStack_38;
  int stackFrameIndex;
  void *callbackState_local;
  JsValueRef *ppvStack_28;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef pvStack_18;
  bool isConstructCall_local;
  JsValueRef callee_local;
  
  pvStack_48 = (JsValueRef)0x0;
  if (2 < argumentCount) {
    pvStack_38 = callbackState;
    callbackState_local._6_2_ = argumentCount;
    ppvStack_28 = arguments;
    arguments_local._7_1_ = isConstructCall;
    pvStack_18 = callee;
    jsErrorCode_00 = ChakraRTInterface::JsNumberToInt(arguments[1],(int *)((long)&result + 4));
    if (jsErrorCode_00 != JsNoError) {
      pPVar1 = PAL_get_stderr(0);
      pWVar2 = Helpers::JsErrorCodeToString(jsErrorCode_00);
      PAL_fwprintf(pPVar1,
                   L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[1], &stackFrameIndex) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)jsErrorCode_00,pWVar2);
      pPVar1 = PAL_get_stderr(0);
      PAL_fflush(pPVar1);
      return (JsValueRef)0x0;
    }
    ChakraRTInterface::JsDiagEvaluate
              (ppvStack_28[2],result._4_4_,JsParseScriptAttributeNone,false,&stack0xffffffffffffffb8
              );
  }
  return pvStack_48;
}

Assistant:

JsValueRef Debugger::Evaluate(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    int stackFrameIndex;
    JsValueRef result = JS_INVALID_REFERENCE;

    if (argumentCount > 2)
    {
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[1], &stackFrameIndex));
        ChakraRTInterface::JsDiagEvaluate(arguments[2], stackFrameIndex, JsParseScriptAttributeNone, /* forceSetValueProp */ false, &result);
    }

    return result;
}